

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::relocate
          (QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *this,qsizetype offset,
          QFlags<Qt::AlignmentFlag> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *in_RDI;
  QFlags<Qt::AlignmentFlag> **unaff_retaddr;
  QFlags<Qt::AlignmentFlag> *res;
  QFlags<Qt::AlignmentFlag> *first;
  QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QFlags<Qt::AlignmentFlag>,long_long>
            (first,(longlong)in_RDI,(QFlags<Qt::AlignmentFlag> *)0x8b44b7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QFlags<Qt::AlignmentFlag>>,QFlags<Qt::AlignmentFlag>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 4 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }